

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O1

SIMDValue Js::SIMDFloat32x4Operation::OpClamp(SIMDValue *value,SIMDValue *lower,SIMDValue *upper)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  SIMDValue SVar6;
  
  fVar1 = (lower->field_0).f32[0];
  if ((lower->field_0).f32[0] <= (value->field_0).f32[0]) {
    fVar1 = (value->field_0).f32[0];
  }
  fVar2 = (lower->field_0).f32[1];
  if ((lower->field_0).f32[1] <= (value->field_0).f32[1]) {
    fVar2 = (value->field_0).f32[1];
  }
  fVar3 = (lower->field_0).f32[2];
  if ((lower->field_0).f32[2] <= (value->field_0).f32[2]) {
    fVar3 = (value->field_0).f32[2];
  }
  fVar4 = (lower->field_0).f32[3];
  if ((lower->field_0).f32[3] <= (value->field_0).f32[3]) {
    fVar4 = (value->field_0).f32[3];
  }
  fVar5 = (upper->field_0).f32[0];
  if (fVar1 <= (upper->field_0).f32[0]) {
    fVar5 = fVar1;
  }
  fVar1 = (upper->field_0).f32[1];
  if (fVar2 <= (upper->field_0).f32[1]) {
    fVar1 = fVar2;
  }
  fVar2 = (upper->field_0).f32[2];
  if (fVar3 <= (upper->field_0).f32[2]) {
    fVar2 = fVar3;
  }
  fVar3 = (upper->field_0).f32[3];
  if (fVar4 <= (upper->field_0).f32[3]) {
    fVar3 = fVar4;
  }
  SVar6.field_0.f32[1] = fVar1;
  SVar6.field_0.f32[0] = fVar5;
  SVar6.field_0.f32[3] = fVar3;
  SVar6.field_0.f32[2] = fVar2;
  return (SIMDValue)SVar6.field_0;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpClamp(const SIMDValue& value, const SIMDValue& lower, const SIMDValue& upper)
    { // SIMD review: do we have intrinsic for the implementation?
        SIMDValue result;

        // lower clamp
        result.f32[SIMD_X] = value.f32[SIMD_X] < lower.f32[SIMD_X] ? lower.f32[SIMD_X] : value.f32[SIMD_X];
        result.f32[SIMD_Y] = value.f32[SIMD_Y] < lower.f32[SIMD_Y] ? lower.f32[SIMD_Y] : value.f32[SIMD_Y];
        result.f32[SIMD_Z] = value.f32[SIMD_Z] < lower.f32[SIMD_Z] ? lower.f32[SIMD_Z] : value.f32[SIMD_Z];
        result.f32[SIMD_W] = value.f32[SIMD_W] < lower.f32[SIMD_W] ? lower.f32[SIMD_W] : value.f32[SIMD_W];

        // upper clamp
        result.f32[SIMD_X] = result.f32[SIMD_X] > upper.f32[SIMD_X] ? upper.f32[SIMD_X] : result.f32[SIMD_X];
        result.f32[SIMD_Y] = result.f32[SIMD_Y] > upper.f32[SIMD_Y] ? upper.f32[SIMD_Y] : result.f32[SIMD_Y];
        result.f32[SIMD_Z] = result.f32[SIMD_Z] > upper.f32[SIMD_Z] ? upper.f32[SIMD_Z] : result.f32[SIMD_Z];
        result.f32[SIMD_W] = result.f32[SIMD_W] > upper.f32[SIMD_W] ? upper.f32[SIMD_W] : result.f32[SIMD_W];

        return result;
    }